

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3GenerateColumnNames(Parse *pParse,Select *pSelect)

{
  sqlite3 *db;
  Vdbe *pVVar1;
  ExprList *pEVar2;
  SrcList *pSVar3;
  ulong uVar4;
  Expr *pEVar5;
  Table *pTVar6;
  Mem *pMVar7;
  char *pcVar8;
  ushort uVar9;
  long lVar10;
  Select *pSVar11;
  code *xDel;
  ExprList_item *pEVar12;
  long lVar13;
  NameContext local_68;
  
  if (pParse->colNamesSet != '\0') {
    return;
  }
  db = pParse->db;
  pVVar1 = pParse->pVdbe;
  do {
    pSVar11 = pSelect;
    pSelect = pSVar11->pPrior;
  } while (pSVar11->pPrior != (Select *)0x0);
  pEVar2 = pSVar11->pEList;
  pSVar3 = pSVar11->pSrc;
  pParse->colNamesSet = '\x01';
  uVar4 = db->flags;
  sqlite3VdbeSetNumCols(pVVar1,pEVar2->nExpr);
  if (0 < pEVar2->nExpr) {
    pEVar12 = pEVar2->a;
    lVar10 = 0;
    lVar13 = 0;
    do {
      pEVar5 = pEVar12->pExpr;
      pcVar8 = pEVar12->zEName;
      if ((pcVar8 == (char *)0x0) || (((pEVar12->fg).field_0x1 & 3) != 0)) {
        if (((uVar4 & 0x44) == 0) || (pEVar5->op != 0xa7)) {
          if (pcVar8 == (char *)0x0) {
            pcVar8 = sqlite3MPrintf(db,"column%d",(ulong)((int)lVar13 + 1));
          }
          else {
            pcVar8 = sqlite3DbStrDup(db,pcVar8);
          }
        }
        else {
          uVar9 = pEVar5->iColumn;
          pTVar6 = (pEVar5->y).pTab;
          if ((short)uVar9 < 0) {
            uVar9 = pTVar6->iPKey;
          }
          pcVar8 = "rowid";
          if (-1 < (short)uVar9) {
            pcVar8 = pTVar6->aCol[uVar9].zCnName;
          }
          if ((uVar4 & 4) == 0) {
            if (pVVar1->db->mallocFailed == '\0') {
              pMVar7 = pVVar1->aColName;
              goto LAB_0017b732;
            }
            goto LAB_0017b7a4;
          }
          pcVar8 = sqlite3MPrintf(db,"%s.%s",pTVar6->zName);
        }
        if (pVVar1->db->mallocFailed == '\0') {
          pMVar7 = pVVar1->aColName;
          xDel = sqlite3OomClear;
LAB_0017b79f:
          sqlite3VdbeMemSetStr((Mem *)((long)&pMVar7->u + lVar10),pcVar8,-1,'\x01',xDel);
        }
      }
      else if (pVVar1->db->mallocFailed == '\0') {
        pMVar7 = pVVar1->aColName;
LAB_0017b732:
        xDel = (_func_void_void_ptr *)0xffffffffffffffff;
        goto LAB_0017b79f;
      }
LAB_0017b7a4:
      lVar13 = lVar13 + 1;
      pEVar12 = pEVar12 + 1;
      lVar10 = lVar10 + 0x38;
    } while (lVar13 < pEVar2->nExpr);
  }
  pVVar1 = pParse->pVdbe;
  local_68.pNext = (NameContext *)0x0;
  if (0 < pEVar2->nExpr) {
    pEVar12 = pEVar2->a;
    lVar10 = 0;
    lVar13 = 0;
    local_68.pParse = pParse;
    local_68.pSrcList = pSVar3;
    do {
      pcVar8 = columnTypeImpl(&local_68,pEVar12->pExpr);
      if (pVVar1->db->mallocFailed == '\0') {
        sqlite3VdbeMemSetStr
                  ((Mem *)((long)&pVVar1->aColName[pVVar1->nResAlloc].u + lVar10),pcVar8,-1,'\x01',
                   (_func_void_void_ptr *)0xffffffffffffffff);
      }
      lVar13 = lVar13 + 1;
      lVar10 = lVar10 + 0x38;
      pEVar12 = pEVar12 + 1;
    } while (lVar13 < pEVar2->nExpr);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateColumnNames(
  Parse *pParse,      /* Parser context */
  Select *pSelect     /* Generate column names for this SELECT statement */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  Table *pTab;
  SrcList *pTabList;
  ExprList *pEList;
  sqlite3 *db = pParse->db;
  int fullName;    /* TABLE.COLUMN if no AS clause and is a direct table ref */
  int srcName;     /* COLUMN or TABLE.COLUMN if no AS clause and is direct */

  if( pParse->colNamesSet ) return;
  /* Column names are determined by the left-most term of a compound select */
  while( pSelect->pPrior ) pSelect = pSelect->pPrior;
  TREETRACE(0x80,pParse,pSelect,("generating column names\n"));
  pTabList = pSelect->pSrc;
  pEList = pSelect->pEList;
  assert( v!=0 );
  assert( pTabList!=0 );
  pParse->colNamesSet = 1;
  fullName = (db->flags & SQLITE_FullColNames)!=0;
  srcName = (db->flags & SQLITE_ShortColNames)!=0 || fullName;
  sqlite3VdbeSetNumCols(v, pEList->nExpr);
  for(i=0; i<pEList->nExpr; i++){
    Expr *p = pEList->a[i].pExpr;

    assert( p!=0 );
    assert( p->op!=TK_AGG_COLUMN );  /* Agg processing has not run yet */
    assert( p->op!=TK_COLUMN
        || (ExprUseYTab(p) && p->y.pTab!=0) ); /* Covering idx not yet coded */
    if( pEList->a[i].zEName && pEList->a[i].fg.eEName==ENAME_NAME ){
      /* An AS clause always takes first priority */
      char *zName = pEList->a[i].zEName;
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_TRANSIENT);
    }else if( srcName && p->op==TK_COLUMN ){
      char *zCol;
      int iCol = p->iColumn;
      pTab = p->y.pTab;
      assert( pTab!=0 );
      if( iCol<0 ) iCol = pTab->iPKey;
      assert( iCol==-1 || (iCol>=0 && iCol<pTab->nCol) );
      if( iCol<0 ){
        zCol = "rowid";
      }else{
        zCol = pTab->aCol[iCol].zCnName;
      }
      if( fullName ){
        char *zName = 0;
        zName = sqlite3MPrintf(db, "%s.%s", pTab->zName, zCol);
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_DYNAMIC);
      }else{
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zCol, SQLITE_TRANSIENT);
      }
    }else{
      const char *z = pEList->a[i].zEName;
      z = z==0 ? sqlite3MPrintf(db, "column%d", i+1) : sqlite3DbStrDup(db, z);
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, z, SQLITE_DYNAMIC);
    }
  }
  generateColumnTypes(pParse, pTabList, pEList);
}